

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperatorOverflowCheck,bool,false,true>
               (uhugeint_t *ldata,uhugeint_t *rdata,uhugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  uhugeint_t left;
  uhugeint_t left_00;
  uhugeint_t uVar11;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar6 = 8;
    while (bVar10 = count != 0, count = count - 1, bVar10) {
      uVar11.upper = *(uint64_t *)((long)&ldata->lower + lVar6);
      uVar11.lower = *(uint64_t *)((long)ldata + lVar6 + -8);
      uVar11 = AddOperatorOverflowCheck::
               Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>(uVar11,*rdata);
      *(uint64_t *)((long)result_data + lVar6 + -8) = uVar11.lower;
      *(uint64_t *)((long)&result_data->lower + lVar6) = uVar11.upper;
      lVar6 = lVar6 + 0x10;
    }
  }
  else {
    uVar7 = 0;
    for (uVar3 = 0; uVar3 != count + 0x3f >> 6; uVar3 = uVar3 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar8 = count;
        }
LAB_017e7828:
        uVar4 = uVar7 << 4 | 8;
        for (; uVar2 = uVar7, uVar7 < uVar8; uVar7 = uVar7 + 1) {
          left.upper = *(uint64_t *)((long)&ldata->lower + uVar4);
          left.lower = *(uint64_t *)((long)ldata + (uVar4 - 8));
          uVar11 = AddOperatorOverflowCheck::
                   Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>(left,*rdata);
          *(uint64_t *)((long)result_data + (uVar4 - 8)) = uVar11.lower;
          *(uint64_t *)((long)&result_data->lower + uVar4) = uVar11.upper;
          uVar4 = uVar4 + 0x10;
        }
      }
      else {
        uVar4 = puVar1[uVar3];
        uVar8 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar8 = count;
        }
        if (uVar4 == 0xffffffffffffffff) goto LAB_017e7828;
        uVar2 = uVar8;
        if (uVar4 != 0) {
          uVar5 = uVar7 << 4 | 8;
          for (uVar9 = 0; uVar2 = uVar9 + uVar7, uVar9 + uVar7 < uVar8; uVar9 = uVar9 + 1) {
            if ((uVar4 >> (uVar9 & 0x3f) & 1) != 0) {
              left_00.upper = *(uint64_t *)((long)&ldata->lower + uVar5);
              left_00.lower = *(uint64_t *)((long)ldata + (uVar5 - 8));
              uVar11 = AddOperatorOverflowCheck::
                       Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                                 (left_00,*rdata);
              *(uint64_t *)((long)result_data + (uVar5 - 8)) = uVar11.lower;
              *(uint64_t *)((long)&result_data->lower + uVar5) = uVar11.upper;
            }
            uVar5 = uVar5 + 0x10;
          }
        }
      }
      uVar7 = uVar2;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}